

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O0

void __thiscall
cppnet::Any::
CHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~CHolder
          (CHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  CHolder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  ~CHolder(this);
  operator_delete(this);
  return;
}

Assistant:

CHolder(const ValueType& value) : _held(value) {
        }